

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_dump(lua_State *L)

{
  int strip;
  int iVar1;
  str_Writer state;
  
  strip = lua_toboolean(L,2);
  iVar1 = lua_type(L,1);
  if (iVar1 == 6) {
    iVar1 = lua_iscfunction(L,1);
    if (iVar1 == 0) goto LAB_00115c7f;
  }
  luaL_argerror(L,1,"Lua function expected");
LAB_00115c7f:
  lua_pushvalue(L,1);
  state.init = 0;
  lua_dump(L,writer,&state,strip);
  lua_settop(L,1);
  return 1;
}

Assistant:

static int str_dump (lua_State *L) {
  struct str_Writer state;
  int strip = lua_toboolean(L, 2);
  luaL_argcheck(L, lua_type(L, 1) == LUA_TFUNCTION && !lua_iscfunction(L, 1),
                   1, "Lua function expected");
  /* ensure function is on the top of the stack and vacate slot 1 */
  lua_pushvalue(L, 1);
  state.init = 0;
  lua_dump(L, writer, &state, strip);
  lua_settop(L, 1);  /* leave final result on top */
  return 1;
}